

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_deleted_doc_right_before_the_end_test(void)

{
  fdb_status fVar1;
  fdb_iterator **ptr_iterator;
  fdb_config *pfVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  fdb_iterator *fit;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char keybuf [256];
  char cmd [256];
  char valuebuf [256];
  fdb_iterator *pfStack_c28;
  fdb_kvs_handle *pfStack_c20;
  fdb_file_handle *pfStack_c18;
  fdb_doc *pfStack_c10;
  fdb_kvs_config fStack_c08;
  timeval tStack_bf0;
  fdb_config fStack_be0;
  fdb_config *pfStack_ae8;
  fdb_iterator *pfStack_ad0;
  fdb_kvs_handle *pfStack_ac8;
  fdb_doc *pfStack_ac0;
  fdb_file_handle *pfStack_ab8;
  fdb_kvs_config fStack_ab0;
  timeval tStack_a98;
  fdb_config fStack_a88;
  fdb_config *pfStack_990;
  fdb_iterator *pfStack_978;
  fdb_kvs_handle *pfStack_970;
  fdb_file_handle *pfStack_968;
  fdb_doc *pfStack_960;
  uint64_t uStack_958;
  undefined1 uStack_950;
  undefined7 uStack_948;
  undefined4 uStack_941;
  undefined8 uStack_938;
  undefined7 uStack_930;
  undefined4 uStack_929;
  fdb_kvs_config fStack_920;
  timeval tStack_908;
  undefined4 uStack_8f8;
  undefined1 uStack_8f4;
  fdb_config fStack_7f0;
  char acStack_6f8 [256];
  fdb_config *pfStack_5f8;
  char *pcStack_5f0;
  code *pcStack_5e8;
  fdb_doc *pfStack_5d0;
  fdb_iterator *pfStack_5c8;
  fdb_kvs_handle *pfStack_5c0;
  fdb_file_handle *pfStack_5b8;
  fdb_kvs_config fStack_5b0;
  timeval tStack_598;
  fdb_config fStack_588;
  fdb_iterator **ppfStack_490;
  fdb_iterator *local_478;
  fdb_doc *local_470;
  fdb_kvs_handle *local_468;
  fdb_file_handle *local_460;
  timeval local_458;
  fdb_iterator *local_448 [33];
  fdb_kvs_config local_340;
  char local_328 [264];
  fdb_config local_220;
  char local_128 [256];
  
  ppfStack_490 = (fdb_iterator **)0x11bbb2;
  gettimeofday(&local_458,(__timezone_ptr_t)0x0);
  ppfStack_490 = (fdb_iterator **)0x11bbb7;
  memleak_start();
  ppfStack_490 = (fdb_iterator **)0x11bbc7;
  fdb_get_default_config();
  local_220.buffercache_size = 0;
  ppfStack_490 = (fdb_iterator **)0x11bbdf;
  fdb_get_default_kvs_config();
  ppfStack_490 = (fdb_iterator **)0x11bc02;
  sprintf(local_328,"rm -rf  %s*","./dummy");
  ppfStack_490 = (fdb_iterator **)0x11bc0a;
  system(local_328);
  ppfStack_490 = (fdb_iterator **)0x11bc1d;
  fdb_open(&local_460,"./dummy",&local_220);
  ppfStack_490 = (fdb_iterator **)0x11bc30;
  fdb_kvs_open(local_460,&local_468,(char *)0x0,&local_340);
  uVar5 = 0;
  do {
    ppfStack_490 = (fdb_iterator **)0x11bc5c;
    sprintf((char *)local_448,"k%06d\n",uVar5);
    ppfStack_490 = (fdb_iterator **)0x11bc6b;
    sprintf(local_128,"v%06d\n",uVar5);
    ppfStack_490 = (fdb_iterator **)0x11bc86;
    fdb_set_kv(local_468,local_448,8,local_128,8);
    uVar3 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar3;
  } while (uVar3 != 3);
  ppfStack_490 = (fdb_iterator **)0x11bca8;
  sprintf((char *)local_448,"k%06d\n",1);
  ppfStack_490 = (fdb_iterator **)0x11bcba;
  fdb_del_kv(local_468,local_448,8);
  ppfStack_490 = (fdb_iterator **)0x11bcc6;
  fdb_commit(local_460,'\0');
  local_448[0]._0_2_ = 0x61;
  local_328[0] = 'z';
  local_328[1] = '\0';
  ppfStack_490 = (fdb_iterator **)0x11bcfd;
  fVar1 = fdb_iterator_init(local_468,&local_478,local_448,1,local_328,1,2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    ppfStack_490 = (fdb_iterator **)0x11bd0f;
    fVar1 = fdb_iterator_seek_to_max(local_478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bf38;
    local_470 = (fdb_doc *)0x0;
    ppfStack_490 = (fdb_iterator **)0x11bd2d;
    fVar1 = fdb_iterator_get(local_478,&local_470);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bf3d;
    ppfStack_490 = (fdb_iterator **)0x11bd50;
    sprintf((char *)local_448,"k%06d\n",2);
    if (*local_470->key != CONCAT62(local_448[0]._2_6_,local_448[0]._0_2_)) goto LAB_0011bf42;
    ppfStack_490 = (fdb_iterator **)0x11bd6a;
    fdb_doc_free(local_470);
    ppfStack_490 = (fdb_iterator **)0x11bd74;
    fVar1 = fdb_iterator_prev(local_478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bf4c;
    local_470 = (fdb_doc *)0x0;
    ppfStack_490 = (fdb_iterator **)0x11bd92;
    fVar1 = fdb_iterator_get(local_478,&local_470);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bf51;
    ppfStack_490 = (fdb_iterator **)0x11bdb2;
    sprintf((char *)local_448,"k%06d\n",0);
    if (*local_470->key != CONCAT62(local_448[0]._2_6_,local_448[0]._0_2_)) goto LAB_0011bf56;
    ppfStack_490 = (fdb_iterator **)0x11bdcc;
    fdb_doc_free(local_470);
    ptr_iterator = &local_478;
    ppfStack_490 = (fdb_iterator **)0x11bdd9;
    fdb_iterator_close(local_478);
    ppfStack_490 = (fdb_iterator **)0x11be05;
    fVar1 = fdb_iterator_init(local_468,ptr_iterator,local_448,1,local_328,1,2);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bf60;
    ppfStack_490 = (fdb_iterator **)0x11be17;
    fVar1 = fdb_iterator_seek_to_min(local_478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bf65;
    local_470 = (fdb_doc *)0x0;
    ppfStack_490 = (fdb_iterator **)0x11be35;
    fVar1 = fdb_iterator_get(local_478,&local_470);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bf6a;
    ptr_iterator = local_448;
    ppfStack_490 = (fdb_iterator **)0x11be55;
    sprintf((char *)ptr_iterator,"k%06d\n",0);
    if (*local_470->key != CONCAT62(local_448[0]._2_6_,local_448[0]._0_2_)) goto LAB_0011bf6f;
    ppfStack_490 = (fdb_iterator **)0x11be6f;
    fdb_doc_free(local_470);
    ppfStack_490 = (fdb_iterator **)0x11be79;
    fVar1 = fdb_iterator_next(local_478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bf79;
    local_470 = (fdb_doc *)0x0;
    ppfStack_490 = (fdb_iterator **)0x11be97;
    fVar1 = fdb_iterator_get(local_478,&local_470);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bf7e;
    ptr_iterator = local_448;
    ppfStack_490 = (fdb_iterator **)0x11beba;
    sprintf((char *)ptr_iterator,"k%06d\n",2);
    if (*local_470->key == CONCAT62(local_448[0]._2_6_,local_448[0]._0_2_)) {
      ppfStack_490 = (fdb_iterator **)0x11bed4;
      fdb_doc_free(local_470);
      ppfStack_490 = (fdb_iterator **)0x11bede;
      fdb_iterator_close(local_478);
      ppfStack_490 = (fdb_iterator **)0x11bee8;
      fdb_close(local_460);
      ppfStack_490 = (fdb_iterator **)0x11beed;
      fdb_shutdown();
      ppfStack_490 = (fdb_iterator **)0x11bef2;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      ppfStack_490 = (fdb_iterator **)0x11bf23;
      fprintf(_stderr,pcVar6,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_490 = (fdb_iterator **)0x11bf38;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf38:
    ppfStack_490 = (fdb_iterator **)0x11bf3d;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf3d:
    ppfStack_490 = (fdb_iterator **)0x11bf42;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf42:
    ppfStack_490 = (fdb_iterator **)0x11bf4c;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf4c:
    ppfStack_490 = (fdb_iterator **)0x11bf51;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf51:
    ppfStack_490 = (fdb_iterator **)0x11bf56;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf56:
    ptr_iterator = local_448;
    ppfStack_490 = (fdb_iterator **)0x11bf60;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf60:
    ppfStack_490 = (fdb_iterator **)0x11bf65;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf65:
    ppfStack_490 = (fdb_iterator **)0x11bf6a;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6a:
    ppfStack_490 = (fdb_iterator **)0x11bf6f;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6f:
    ppfStack_490 = (fdb_iterator **)0x11bf79;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf79:
    ppfStack_490 = (fdb_iterator **)0x11bf7e;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf7e:
    ppfStack_490 = (fdb_iterator **)0x11bf83;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_490 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_5e8 = (code *)0x11bfa1;
  ppfStack_490 = ptr_iterator;
  gettimeofday(&tStack_598,(__timezone_ptr_t)0x0);
  pfStack_5d0 = (fdb_doc *)0x0;
  pcStack_5e8 = (code *)0x11bfaf;
  memleak_start();
  pfVar2 = &fStack_588;
  pcStack_5e8 = (code *)0x11bfbc;
  fdb_get_default_config();
  pcStack_5e8 = (code *)0x11bfc6;
  fdb_get_default_kvs_config();
  pcStack_5e8 = (code *)0x11bfd2;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_5e8 = (code *)0x11bfe6;
  fVar1 = fdb_open(&pfStack_5b8,"./iterator_test1",pfVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_5e8 = (code *)0x11c002;
    fVar1 = fdb_kvs_open_default(pfStack_5b8,&pfStack_5c0,&fStack_5b0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c20d;
    pcStack_5e8 = (code *)0x11c025;
    fdb_set_kv(pfStack_5c0,"a",1,(void *)0x0,0);
    pfVar2 = (fdb_config *)0x154b95;
    pcStack_5e8 = (code *)0x11c043;
    fdb_set_kv(pfStack_5c0,"b",1,(void *)0x0,0);
    pcStack_5e8 = (code *)0x11c05e;
    fdb_set_kv(pfStack_5c0,"c",1,(void *)0x0,0);
    pcStack_5e8 = (code *)0x11c082;
    fVar1 = fdb_iterator_init(pfStack_5c0,&pfStack_5c8,"b",1,(void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c214;
    pcStack_5e8 = (code *)0x11c094;
    fVar1 = fdb_iterator_seek_to_min(pfStack_5c8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c219;
    pcStack_5e8 = (code *)0x11c0ab;
    fVar1 = fdb_iterator_get(pfStack_5c8,&pfStack_5d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c220;
    if (*pfStack_5d0->key != 'b') goto LAB_0011c227;
    pcStack_5e8 = (code *)0x11c0ca;
    fdb_doc_free(pfStack_5d0);
    pfStack_5d0 = (fdb_doc *)0x0;
    pcStack_5e8 = (code *)0x11c0dd;
    fVar1 = fdb_iterator_seek_to_max(pfStack_5c8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c22f;
    pcStack_5e8 = (code *)0x11c0f4;
    fVar1 = fdb_iterator_get(pfStack_5c8,&pfStack_5d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c236;
    if (*pfStack_5d0->key != 'c') goto LAB_0011c23d;
    pcStack_5e8 = (code *)0x11c113;
    fdb_doc_free(pfStack_5d0);
    pfStack_5d0 = (fdb_doc *)0x0;
    pcStack_5e8 = (code *)0x11c126;
    fVar1 = fdb_iterator_prev(pfStack_5c8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c245;
    pcStack_5e8 = (code *)0x11c13d;
    fVar1 = fdb_iterator_get(pfStack_5c8,&pfStack_5d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c24c;
    if (*pfStack_5d0->key != 'b') goto LAB_0011c253;
    pcStack_5e8 = (code *)0x11c15c;
    fdb_doc_free(pfStack_5d0);
    pfStack_5d0 = (fdb_doc *)0x0;
    pcStack_5e8 = (code *)0x11c16f;
    fVar1 = fdb_iterator_next(pfStack_5c8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c25b;
    pcStack_5e8 = (code *)0x11c186;
    fVar1 = fdb_iterator_get(pfStack_5c8,&pfStack_5d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c262;
    if (*pfStack_5d0->key == 'c') {
      pcStack_5e8 = (code *)0x11c1a5;
      fdb_doc_free(pfStack_5d0);
      pfStack_5d0 = (fdb_doc *)0x0;
      pcStack_5e8 = (code *)0x11c1b8;
      fdb_iterator_close(pfStack_5c8);
      pcStack_5e8 = (code *)0x11c1c2;
      fdb_close(pfStack_5b8);
      pcStack_5e8 = (code *)0x11c1c7;
      fdb_shutdown();
      pcStack_5e8 = (code *)0x11c1cc;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pcStack_5e8 = (code *)0x11c1fd;
      fprintf(_stderr,pcVar6,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_5e8 = (code *)0x11c20d;
    iterator_uncommited_seeks();
LAB_0011c20d:
    pcStack_5e8 = (code *)0x11c214;
    iterator_uncommited_seeks();
LAB_0011c214:
    pcStack_5e8 = (code *)0x11c219;
    iterator_uncommited_seeks();
LAB_0011c219:
    pcStack_5e8 = (code *)0x11c220;
    iterator_uncommited_seeks();
LAB_0011c220:
    pcStack_5e8 = (code *)0x11c227;
    iterator_uncommited_seeks();
LAB_0011c227:
    pcStack_5e8 = (code *)0x11c22f;
    iterator_uncommited_seeks();
LAB_0011c22f:
    pcStack_5e8 = (code *)0x11c236;
    iterator_uncommited_seeks();
LAB_0011c236:
    pcStack_5e8 = (code *)0x11c23d;
    iterator_uncommited_seeks();
LAB_0011c23d:
    pcStack_5e8 = (code *)0x11c245;
    iterator_uncommited_seeks();
LAB_0011c245:
    pcStack_5e8 = (code *)0x11c24c;
    iterator_uncommited_seeks();
LAB_0011c24c:
    pcStack_5e8 = (code *)0x11c253;
    iterator_uncommited_seeks();
LAB_0011c253:
    pcStack_5e8 = (code *)0x11c25b;
    iterator_uncommited_seeks();
LAB_0011c25b:
    pcStack_5e8 = (code *)0x11c262;
    iterator_uncommited_seeks();
LAB_0011c262:
    pcStack_5e8 = (code *)0x11c269;
    iterator_uncommited_seeks();
  }
  pcStack_5e8 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_990 = (fdb_config *)0x11c28b;
  pfStack_5f8 = pfVar2;
  pcStack_5f0 = (char *)local_448;
  pcStack_5e8 = (code *)uVar5;
  gettimeofday(&tStack_908,(__timezone_ptr_t)0x0);
  pfStack_990 = (fdb_config *)0x11c290;
  memleak_start();
  pfVar2 = &fStack_7f0;
  pfStack_990 = (fdb_config *)0x11c2a0;
  fdb_get_default_config();
  fStack_7f0.buffercache_size = 0;
  pfStack_990 = (fdb_config *)0x11c2b2;
  fdb_get_default_kvs_config();
  pfStack_990 = (fdb_config *)0x11c2d2;
  sprintf(acStack_6f8,"rm -rf  %s*","./iterator_test");
  pfStack_990 = (fdb_config *)0x11c2da;
  system(acStack_6f8);
  pfStack_990 = (fdb_config *)0x11c2ee;
  fVar1 = fdb_open(&pfStack_968,"./iterator_test1",pfVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_990 = (fdb_config *)0x11c30c;
    fVar1 = fdb_kvs_open(pfStack_968,&pfStack_970,(char *)0x0,&fStack_920);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c4a6;
    uStack_930 = 0x34323634353773;
    uStack_929 = 0xff;
    uStack_948 = 0x34323634353773;
    uStack_941 = 0x10000ff;
    uStack_938._0_4_ = 0x34353773;
    uStack_938._4_1_ = true;
    uStack_938._5_1_ = true;
    uStack_938._6_1_ = '4';
    uStack_938._7_1_ = 0xff;
    uStack_958 = 0xff34323634353773;
    uStack_950 = 0xff;
    uStack_8f8 = 0x3179656b;
    uStack_8f4 = 0;
    pfStack_990 = (fdb_config *)0x11c370;
    fVar1 = fdb_set_kv(pfStack_970,&uStack_930,0xb,&uStack_8f8,4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c4ab;
    uStack_8f4 = 0;
    uStack_8f8 = 0x3279656b;
    pfStack_990 = (fdb_config *)0x11c3a4;
    fVar1 = fdb_set_kv(pfStack_970,&uStack_948,0xb,&uStack_8f8,4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c4b0;
    pfStack_990 = (fdb_config *)0x11c3bb;
    fVar1 = fdb_commit(pfStack_968,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c4b5;
    pfStack_990 = (fdb_config *)0x11c3ee;
    fVar1 = fdb_iterator_init(pfStack_970,&pfStack_978,&uStack_938,8,&uStack_958,9,10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c4ba;
    iVar4 = 0;
    pfVar2 = (fdb_config *)&pfStack_960;
    do {
      pfStack_960 = (fdb_doc *)0x0;
      pfStack_990 = (fdb_config *)0x11c413;
      fVar1 = fdb_iterator_get(pfStack_978,(fdb_doc **)pfVar2);
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      iVar4 = iVar4 + 1;
      pfStack_990 = (fdb_config *)0x11c423;
      fdb_doc_free(pfStack_960);
      pfStack_990 = (fdb_config *)0x11c42d;
      fVar1 = fdb_iterator_next(pfStack_978);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    if (iVar4 != 2) goto LAB_0011c4bf;
    pfStack_990 = (fdb_config *)0x11c444;
    fVar1 = fdb_iterator_close(pfStack_978);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c4c4;
    pfStack_990 = (fdb_config *)0x11c452;
    fVar1 = fdb_close(pfStack_968);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c4c9;
    pfStack_990 = (fdb_config *)0x11c45b;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_990 = (fdb_config *)0x11c464;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_990 = (fdb_config *)0x11c495;
      fprintf(_stderr,pcVar6,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_990 = (fdb_config *)0x11c4a6;
    iterator_init_using_substring_test();
LAB_0011c4a6:
    pfStack_990 = (fdb_config *)0x11c4ab;
    iterator_init_using_substring_test();
LAB_0011c4ab:
    pfStack_990 = (fdb_config *)0x11c4b0;
    iterator_init_using_substring_test();
LAB_0011c4b0:
    pfStack_990 = (fdb_config *)0x11c4b5;
    iterator_init_using_substring_test();
LAB_0011c4b5:
    pfStack_990 = (fdb_config *)0x11c4ba;
    iterator_init_using_substring_test();
LAB_0011c4ba:
    pfStack_990 = (fdb_config *)0x11c4bf;
    iterator_init_using_substring_test();
LAB_0011c4bf:
    pfStack_990 = (fdb_config *)0x11c4c4;
    iterator_init_using_substring_test();
LAB_0011c4c4:
    pfStack_990 = (fdb_config *)0x11c4c9;
    iterator_init_using_substring_test();
LAB_0011c4c9:
    pfStack_990 = (fdb_config *)0x11c4ce;
    iterator_init_using_substring_test();
  }
  pfStack_990 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_ae8 = (fdb_config *)0x11c4e9;
  pfStack_990 = pfVar2;
  gettimeofday(&tStack_a98,(__timezone_ptr_t)0x0);
  pfStack_ae8 = (fdb_config *)0x11c4ee;
  memleak_start();
  pfStack_ad0 = (fdb_iterator *)0x0;
  pfStack_ac0 = (fdb_doc *)0x0;
  pfVar2 = &fStack_a88;
  pfStack_ae8 = (fdb_config *)0x11c505;
  fdb_get_default_config();
  pfStack_ae8 = (fdb_config *)0x11c50f;
  fdb_get_default_kvs_config();
  pfStack_ae8 = (fdb_config *)0x11c51b;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_ae8 = (fdb_config *)0x11c52f;
  fVar1 = fdb_open(&pfStack_ab8,"./iterator_test1",pfVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_ae8 = (fdb_config *)0x11c54b;
    fVar1 = fdb_kvs_open_default(pfStack_ab8,&pfStack_ac8,&fStack_ab0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c708;
    pfStack_ae8 = (fdb_config *)0x11c56e;
    fdb_set_kv(pfStack_ac8,"A",1,(void *)0x0,0);
    pfVar2 = (fdb_config *)0x154dcc;
    pfStack_ae8 = (fdb_config *)0x11c58c;
    fdb_set_kv(pfStack_ac8,"B",1,(void *)0x0,0);
    pfStack_ae8 = (fdb_config *)0x11c5b7;
    fVar1 = fdb_iterator_init(pfStack_ac8,&pfStack_ad0,"B",1,"Bzz",3,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c70f;
    pfStack_ae8 = (fdb_config *)0x11c5c9;
    fVar1 = fdb_iterator_seek_to_max(pfStack_ad0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c714;
    pfStack_ae8 = (fdb_config *)0x11c5e0;
    fVar1 = fdb_iterator_get(pfStack_ad0,&pfStack_ac0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c71b;
    if (*pfStack_ac0->key != 'B') goto LAB_0011c722;
    pfStack_ae8 = (fdb_config *)0x11c5ff;
    fdb_doc_free(pfStack_ac0);
    pfStack_ac0 = (fdb_doc *)0x0;
    pfStack_ae8 = (fdb_config *)0x11c612;
    fVar1 = fdb_iterator_close(pfStack_ad0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c72a;
    pfStack_ad0 = (fdb_iterator *)0x0;
    pfStack_ae8 = (fdb_config *)0x11c639;
    fVar1 = fdb_del_kv(pfStack_ac8,"B",1);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c731;
    pfStack_ae8 = (fdb_config *)0x11c670;
    fVar1 = fdb_iterator_init(pfStack_ac8,&pfStack_ad0,"B",1,"Bzz",3,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c738;
    pfStack_ae8 = (fdb_config *)0x11c687;
    fVar1 = fdb_iterator_get(pfStack_ad0,&pfStack_ac0);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c73d;
    pfStack_ae8 = (fdb_config *)0x11c69a;
    fVar1 = fdb_iterator_seek_to_max(pfStack_ad0);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c742;
    pfStack_ae8 = (fdb_config *)0x11c6ad;
    fVar1 = fdb_close(pfStack_ab8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c747;
    pfStack_ae8 = (fdb_config *)0x11c6ba;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_ae8 = (fdb_config *)0x11c6c7;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_ae8 = (fdb_config *)0x11c6f8;
      fprintf(_stderr,pcVar6,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_ae8 = (fdb_config *)0x11c708;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c708:
    pfStack_ae8 = (fdb_config *)0x11c70f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c70f:
    pfStack_ae8 = (fdb_config *)0x11c714;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c714:
    pfStack_ae8 = (fdb_config *)0x11c71b;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c71b:
    pfStack_ae8 = (fdb_config *)0x11c722;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c722:
    pfStack_ae8 = (fdb_config *)0x11c72a;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c72a:
    pfStack_ae8 = (fdb_config *)0x11c731;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c731:
    pfStack_ae8 = (fdb_config *)0x11c738;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c738:
    pfStack_ae8 = (fdb_config *)0x11c73d;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c73d:
    pfStack_ae8 = (fdb_config *)0x11c742;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c742:
    pfStack_ae8 = (fdb_config *)0x11c747;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c747:
    pfStack_ae8 = (fdb_config *)0x11c74e;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_ae8 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_ae8 = pfVar2;
  gettimeofday(&tStack_bf0,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_c28 = (fdb_iterator *)0x0;
  pfStack_c10 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar1 = fdb_open(&pfStack_c18,"./iterator_test1",&fStack_be0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open_default(pfStack_c18,&pfStack_c20,&fStack_c08);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c8f5;
    fdb_set_kv(pfStack_c20,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_c20,"C",1,(void *)0x0,0);
    fVar1 = fdb_del_kv(pfStack_c20,"B",1);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c8fc;
    fVar1 = fdb_iterator_init(pfStack_c20,&pfStack_c28,"A",1,"B",1,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c903;
    fVar1 = fdb_iterator_get(pfStack_c28,&pfStack_c10);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c908;
    fVar1 = fdb_iterator_seek_to_min(pfStack_c28);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c90d;
    fVar1 = fdb_iterator_close(pfStack_c28);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c912;
    fVar1 = fdb_close(pfStack_c18);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar6 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar6,"iterator seek to min test");
        return;
      }
      goto LAB_0011c920;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8f5:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8fc:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c903:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c908:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c90d:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c912:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c920:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar4 = 0;
  do {
    iterator_complete_test(iVar4,0);
    iterator_complete_test(iVar4,1);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_deleted_doc_right_before_the_end_test()
{
    TEST_INIT();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *fit;
    fdb_doc *rdoc;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256], cmd[256];

    memleak_start();

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    kvs_config = fdb_get_default_kvs_config();

    sprintf(cmd, SHELL_DEL " %s*", "./dummy");
    r = system(cmd); (void)r;

    fdb_open(&dbfile, "./dummy", &config);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);

    // insert 3 docs
    for (i=0;i<3;++i) {
        sprintf(keybuf, "k%06d\n", i);
        sprintf(valuebuf, "v%06d\n", i);
        fdb_set_kv(db, keybuf, 8, valuebuf, 8);
    }

    // delete the middle doc
    i = 1;
    sprintf(keybuf, "k%06d\n", i);
    fdb_del_kv(db, keybuf, 8);

    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    sprintf(keybuf, "a");
    sprintf(cmd, "z");
    s = fdb_iterator_init(db, &fit, keybuf, 1, cmd, 1, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 2;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    s = fdb_iterator_prev(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    fdb_iterator_close(fit);

    // opposite case
    s = fdb_iterator_init(db, &fit, keybuf, 1, cmd, 1, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_iterator_seek_to_min(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    s = fdb_iterator_next(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 2;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    fdb_iterator_close(fit);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator deleted doc right before the end of iteration test");
}